

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O0

void __thiscall
FastPForLib::VByte::encodeToByteArray
          (VByte *this,uint32_t *in,size_t length,uint8_t *bout,size_t *nvalue)

{
  uint uVar1;
  byte bVar2;
  uint32_t val;
  size_t k;
  uint8_t *initbout;
  size_t *nvalue_local;
  uint8_t *bout_local;
  size_t length_local;
  uint32_t *in_local;
  VByte *this_local;
  
  bout_local = bout;
  for (k = 0; k < length; k = k + 1) {
    uVar1 = in[k];
    bVar2 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *bout_local = bVar2 & 0x7f;
      bout_local = bout_local + 1;
    }
    else if (uVar1 < 0x4000) {
      *bout_local = bVar2 & 0x7f | 0x80;
      bout_local[1] = (uint8_t)(uVar1 >> 7);
      bout_local = bout_local + 2;
    }
    else if (uVar1 < 0x200000) {
      *bout_local = bVar2 & 0x7f | 0x80;
      bout_local[1] = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      bout_local[2] = (uint8_t)(uVar1 >> 0xe);
      bout_local = bout_local + 3;
    }
    else if (uVar1 < 0x10000000) {
      *bout_local = bVar2 & 0x7f | 0x80;
      bout_local[1] = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      bout_local[2] = (byte)(uVar1 >> 0xe) & 0x7f | 0x80;
      bout_local[3] = (uint8_t)(uVar1 >> 0x15);
      bout_local = bout_local + 4;
    }
    else {
      *bout_local = bVar2 & 0x7f | 0x80;
      bout_local[1] = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      bout_local[2] = (byte)(uVar1 >> 0xe) & 0x7f | 0x80;
      bout_local[3] = (byte)(uVar1 >> 0x15) & 0x7f | 0x80;
      bout_local[4] = (byte)(uVar1 >> 0x1c);
      bout_local = bout_local + 5;
    }
  }
  *nvalue = (long)bout_local - (long)bout;
  return;
}

Assistant:

void encodeToByteArray(const uint32_t *in, const size_t length, uint8_t *bout,
                         size_t &nvalue) {
    const uint8_t *const initbout = bout;
    for (size_t k = 0; k < length; ++k) {
      const uint32_t val = in[k];
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1U << 7)) {
        *bout = val & 0x7F;
        ++bout;
      } else if (val < (1U << 14)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 7);
        ++bout;
      } else if (val < (1U << 21)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 14);
        ++bout;
      } else if (val < (1U << 28)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 21);
        ++bout;
      } else {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 21) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 28);
        ++bout;
      }
    }
    nvalue = bout - initbout;
  }